

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ProtoPathAndDescriptorSetIn_Test::
~CommandLineInterfaceTest_ProtoPathAndDescriptorSetIn_Test
          (CommandLineInterfaceTest_ProtoPathAndDescriptorSetIn_Test *this)

{
  CommandLineInterfaceTest_ProtoPathAndDescriptorSetIn_Test *this_local;
  
  ~CommandLineInterfaceTest_ProtoPathAndDescriptorSetIn_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ProtoPathAndDescriptorSetIn) {
  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir --descriptor_set_in=$tmpdir/foo.bin foo.proto");
  ExpectErrorText("$tmpdir/foo.bin: No such file or directory\n");

  Run("protocol_compiler --test_out=$tmpdir "
      "--descriptor_set_in=$tmpdir/foo.bin --proto_path=$tmpdir foo.proto");
  ExpectErrorText("$tmpdir/foo.bin: No such file or directory\n");
}